

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CtorExceptionTextTest.cpp
# Opt level: O0

void __thiscall CtorExceptionTextTest::CtorExceptionTextTest(CtorExceptionTextTest *this)

{
  shared_ptr<oout::EqualMatch> local_a8;
  shared_ptr<oout::CtorExceptionText<WithException>_> local_98;
  shared_ptr<const_oout::NamedTest> local_88;
  shared_ptr<oout::EqualMatch> local_78;
  shared_ptr<oout::CtorExceptionText<WithException>_> local_68;
  shared_ptr<const_oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  CtorExceptionTextTest *local_10;
  CtorExceptionTextTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Exception in ctor represent as a text",&local_31);
  std::make_shared<oout::CtorExceptionText<WithException>>();
  std::make_shared<oout::EqualMatch,char_const(&)[12]>((char (*) [12])&local_78);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[41],std::shared_ptr<oout::CtorExceptionText<WithException>>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [41])local_58,
             (shared_ptr<oout::CtorExceptionText<WithException>_> *)
             "CtorExceptionText is a exception message",(shared_ptr<oout::EqualMatch> *)&local_68);
  std::make_shared<oout::CtorExceptionText<WithException>,char_const(&)[9]>((char (*) [9])&local_98)
  ;
  std::make_shared<oout::EqualMatch,char_const(&)[9]>((char (*) [9])&local_a8);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[40],std::shared_ptr<oout::CtorExceptionText<WithException>>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [40])&local_88,
             (shared_ptr<oout::CtorExceptionText<WithException>_> *)
             "CtorExceptionText pass args to CUT ctor",(shared_ptr<oout::EqualMatch> *)&local_98);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_30,local_58,&local_88);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_88);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_a8);
  std::shared_ptr<oout::CtorExceptionText<WithException>_>::~shared_ptr(&local_98);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_78);
  std::shared_ptr<oout::CtorExceptionText<WithException>_>::~shared_ptr(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__CtorExceptionTextTest_00323d50;
  return;
}

Assistant:

CtorExceptionTextTest::CtorExceptionTextTest()
: dirty::Test(
	"Exception in ctor represent as a text",
	make_shared<const NamedTest>(
		"CtorExceptionText is a exception message",
		make_shared<CtorExceptionText<WithException>>(),
		make_shared<EqualMatch>("shit happen")
	),
	make_shared<const NamedTest>(
		"CtorExceptionText pass args to CUT ctor",
		make_shared<CtorExceptionText<WithException>>("argument"),
		make_shared<EqualMatch>("argument")
	)
)
{
}